

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedefNameTypeResolver.h
# Opt level: O1

void __thiscall
psy::C::TypedefNameTypeResolver::~TypedefNameTypeResolver(TypedefNameTypeResolver *this)

{
  SyntaxVisitor::~SyntaxVisitor(&this->super_SyntaxVisitor);
  operator_delete(this,0x20);
  return;
}

Assistant:

class PSY_C_INTERNAL_API TypedefNameTypeResolver final : protected SyntaxVisitor
{
PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(Compilation);

    TypedefNameTypeResolver(SemanticModel* semaModel, const SyntaxTree* tree);
    TypedefNameTypeResolver(const TypedefNameTypeResolver&) = delete;
    void operator=(const TypedefNameTypeResolver&) = delete;

    void resolveTypedefNameTypes();

private:
    SemanticModel* semaModel_;
    bool inTydefDecltor_;

    const Type* resolve(const Type* ty);

    //--------------//
    // Declarations //
    //--------------//
    virtual Action visitTypedefDeclaration(const TypedefDeclarationSyntax*) override;

    /* Declarators */
    virtual Action visitIdentifierDeclarator(const IdentifierDeclaratorSyntax*) override;
}